

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O3

void __thiscall rest_rpc::rpc_client::clear_cache(rpc_client *this)

{
  _Elt_pointer pcVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &this->write_mtx_;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  pcVar1 = (this->outbox_).
           super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->outbox_).
      super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != pcVar1) {
    do {
      free((pcVar1->content).data_);
      std::
      deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
      ::pop_front(&this->outbox_);
      pcVar1 = (this->outbox_).
               super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->outbox_).
             super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != pcVar1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  local_20._M_device = &this->cb_mtx_;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->callback_map_)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->future_map_)._M_h);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void clear_cache() {
    {
      std::unique_lock<std::mutex> lock(write_mtx_);
      while (!outbox_.empty()) {
        ::free((char *)outbox_.front().content.data());
        outbox_.pop_front();
      }
    }

    {
      std::unique_lock<std::mutex> lock(cb_mtx_);
      callback_map_.clear();
      future_map_.clear();
    }
  }